

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O0

size_t Curl_strlcat(char *dst,char *src,size_t siz)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  anon_union_8_2_43af0e2a dlen;
  size_t n;
  char *s;
  char *d;
  size_t siz_local;
  char *src_local;
  char *dst_local;
  
  dlen.uns = siz;
  s = dst;
  while( true ) {
    bVar3 = false;
    if (dlen.sig != 0) {
      bVar3 = *s != '\0';
    }
    if (!bVar3) break;
    s = s + 1;
    dlen.sig = dlen.sig + -1;
  }
  lVar1 = (long)s - (long)dst;
  dlen.sig = siz - lVar1;
  n = (size_t)src;
  if (dlen.sig == 0) {
    sVar2 = strlen(src);
  }
  else {
    for (; *(char *)n != '\0'; n = n + 1) {
      if (dlen.sig != 1) {
        *s = *(char *)n;
        dlen.sig = dlen.sig + -1;
        s = s + 1;
      }
    }
    *s = '\0';
    sVar2 = n - (long)src;
  }
  dst_local = (char *)(lVar1 + sVar2);
  return (size_t)dst_local;
}

Assistant:

size_t Curl_strlcat(char *dst, const char *src, size_t siz)
{
  char *d = dst;
  const char *s = src;
  size_t n = siz;
  union {
    ssize_t sig;
     size_t uns;
  } dlen;

  /* Find the end of dst and adjust bytes left but don't go past end */
  while(n-- != 0 && *d != '\0')
    d++;
  dlen.sig = d - dst;
  n = siz - dlen.uns;

  if(n == 0)
    return(dlen.uns + strlen(s));
  while(*s != '\0') {
    if(n != 1) {
      *d++ = *s;
      n--;
    }
    s++;
  }
  *d = '\0';

  return(dlen.uns + (s - src));     /* count does not include NUL */
}